

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O1

RunElement __thiscall
duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::StartGames
          (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *this,
          Games *losers,RunElements *elements,RunElement *sentinel)

{
  long lVar1;
  long lVar2;
  long lVar3;
  pair<unsigned_int,_unsigned_long> *ppVar4;
  pair<unsigned_int,_unsigned_long> *ppVar5;
  pair<unsigned_int,_unsigned_long> *ppVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  pair<unsigned_int,_unsigned_long> *ppVar10;
  uint *puVar11;
  uint uVar12;
  uint *puVar13;
  RunElement RVar14;
  uint auStack_208 [2];
  unsigned_long local_200 [2];
  uint auStack_1f0 [2];
  ulong uStack_1e8;
  uint auStack_1e0 [52];
  uint auStack_110 [2];
  unsigned_long auStack_108 [31];
  
  lVar1 = 8;
  do {
    *(undefined4 *)((long)auStack_208 + lVar1) = 0;
    *(undefined8 *)((long)local_200 + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x1f8);
  lVar1 = 0xf8;
  lVar2 = 0;
  ppVar4 = elements->_M_elems;
  do {
    ppVar5 = elements->_M_elems + lVar2 * 2 + 1;
    uVar8 = ((pair<unsigned_int,_unsigned_long> *)&ppVar4->first)->first;
    uVar12 = ppVar4[1].first;
    if ((uVar8 < uVar12) ||
       ((ppVar6 = ppVar5, ppVar10 = ppVar4, uVar8 <= uVar12 && (ppVar4->second < ppVar4[1].second)))
       ) {
      ppVar6 = ppVar4;
      ppVar10 = ppVar5;
      uVar8 = uVar12;
    }
    *(uint *)((long)losers->_M_elems + lVar1 + -8) = uVar8;
    *(unsigned_long *)((long)&losers->_M_elems[0].first + lVar1) = ppVar10->second;
    *(uint *)((long)auStack_208 + lVar1) =
         ((pair<unsigned_int,_unsigned_long> *)&ppVar6->first)->first;
    *(unsigned_long *)((long)local_200 + lVar1) = ppVar6->second;
    lVar2 = lVar2 + 1;
    lVar1 = lVar1 + 0x10;
    ppVar4 = ppVar4 + 2;
  } while (lVar1 != 0x1f8);
  lVar1 = 0xe;
  lVar2 = 0x74;
  lVar3 = 0x1d0;
  do {
    puVar11 = (uint *)((long)local_200 + lVar3);
    puVar13 = auStack_1e0 + lVar1 * 8;
    uVar8 = *puVar11;
    uVar12 = *(uint *)((long)auStack_1f0 + lVar3);
    puVar7 = puVar11;
    uVar9 = uVar8;
    if ((uVar12 <= uVar8) &&
       ((uVar12 < uVar8 ||
        (*(ulong *)((long)&uStack_1e8 + lVar3) <= *(ulong *)((long)auStack_1f0 + lVar3 + -8))))) {
      puVar7 = puVar13;
      puVar13 = puVar11;
      uVar9 = uVar12;
      uVar12 = uVar8;
    }
    *(uint *)((long)losers->_M_elems + lVar2 * 2 + -8) = uVar12;
    *(undefined8 *)((long)&losers->_M_elems[0].first + lVar2 * 2) = *(undefined8 *)(puVar13 + 2);
    *(uint *)((long)auStack_208 + lVar2 * 2) = uVar9;
    *(undefined8 *)((long)local_200 + lVar2 * 2) = *(undefined8 *)(puVar7 + 2);
    lVar1 = lVar1 + -1;
    lVar2 = lVar2 + -8;
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x10);
  RVar14._4_4_ = 0;
  RVar14.first = (uint)local_200[0];
  RVar14.second = local_200[1];
  return RVar14;
}

Assistant:

RunElement StartGames(Games &losers, const RunElements &elements, const RunElement &sentinel) {
		const auto elem_nodes = elements.size();
		const auto game_nodes = losers.size();
		Games winners;

		//	Play the first round of games,
		//	placing the losers at the bottom of the game
		const auto base_offset = game_nodes / 2;
		auto losers_base = losers.data() + base_offset;
		auto winners_base = winners.data() + base_offset;

		const auto base_count = elem_nodes / 2;
		for (idx_t i = 0; i < base_count; ++i) {
			const auto &e0 = elements[i * 2 + 0];
			const auto &e1 = elements[i * 2 + 1];
			if (cmp(e0, e1)) {
				losers_base[i] = e1;
				winners_base[i] = e0;
			} else {
				losers_base[i] = e0;
				winners_base[i] = e1;
			}
		}

		//	Fill in any byes
		if (elem_nodes % 2) {
			winners_base[base_count] = elements.back();
			losers_base[base_count] = sentinel;
		}

		//	Pad to a power of 2
		const auto base_size = (game_nodes + 1) / 2;
		for (idx_t i = (elem_nodes + 1) / 2; i < base_size; ++i) {
			winners_base[i] = sentinel;
			losers_base[i] = sentinel;
		}

		//	Play the winners against each other
		//	and stick the losers in the upper levels of the tournament tree
		for (idx_t i = base_offset; i-- > 0;) {
			//	Indexing backwards
			const auto &e0 = winners[i * 2 + 1];
			const auto &e1 = winners[i * 2 + 2];
			if (cmp(e0, e1)) {
				losers[i] = e1;
				winners[i] = e0;
			} else {
				losers[i] = e0;
				winners[i] = e1;
			}
		}

		//	Return the final winner
		return winners[0];
	}